

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O0

void __thiscall
gvr::MultiTexturedMesh::savePLY(MultiTexturedMesh *this,char *plyname,bool all,ply_encoding enc)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  int in_ECX;
  size_t sVar5;
  byte in_DL;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  int iVar6;
  char *in_RSI;
  string *psVar7;
  MultiTexturedMesh *in_RDI;
  int i_2;
  int i_1;
  size_t i;
  PLYWriter ply;
  int in_stack_fffffffffffff97c;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  float in_stack_fffffffffffff98c;
  float in_stack_fffffffffffff990;
  float in_stack_fffffffffffff994;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  allocator *in_stack_fffffffffffffa50;
  ply_type pVar8;
  allocator *in_stack_fffffffffffffa58;
  PLYWriter *in_stack_fffffffffffffa60;
  int local_544;
  uint local_540;
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator<char> local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [24];
  PLYWriter *in_stack_fffffffffffffd38;
  Model *in_stack_fffffffffffffd40;
  string local_2b8 [32];
  string local_298 [32];
  ulong local_278;
  PLYWriter local_260;
  int local_18;
  byte local_11;
  char *local_10;
  
  local_11 = in_DL & 1;
  local_18 = in_ECX;
  local_10 = in_RSI;
  PLYWriter::PLYWriter((PLYWriter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
  PLYWriter::open(&local_260,local_10,local_18);
  Model::setOriginToPLY(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  for (local_278 = 0; uVar1 = local_278,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&in_RDI->name), uVar1 < sVar4; local_278 = local_278 + 1) {
    getTextureName_abi_cxx11_
              ((MultiTexturedMesh *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
               in_stack_fffffffffffff97c);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    PLYWriter::addComment
              ((PLYWriter *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               (string *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    std::__cxx11::string::~string(local_298);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"vertex",(allocator *)&stack0xfffffffffffffd47);
  PointCloud::getVertexCount((PointCloud *)in_RDI);
  PLYWriter::addElement
            ((PLYWriter *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
             (string *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd47);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"x",&local_2e1);
  PLYWriter::addProperty
            (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
             (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"y",&local_309);
  PLYWriter::addProperty
            (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
             (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"z",&local_331);
  PLYWriter::addProperty
            (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
             (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  bVar2 = PointCloud::hasScanProp((PointCloud *)in_RDI);
  if (bVar2) {
    in_stack_fffffffffffffa60 = (PLYWriter *)&local_359;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358,"scan_size",(allocator *)in_stack_fffffffffffffa60);
    PLYWriter::addProperty
              (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
               (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
    std::__cxx11::string::~string(local_358);
    std::allocator<char>::~allocator(&local_359);
    if ((local_11 & 1) != 0) {
      in_stack_fffffffffffffa58 = &local_381;
      std::allocator<char>::allocator();
      pVar8 = (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20);
      std::__cxx11::string::string(local_380,"scan_error",in_stack_fffffffffffffa58);
      PLYWriter::addProperty(in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,pVar8);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
      in_stack_fffffffffffffa50 = &local_3a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a8,"scan_conf",in_stack_fffffffffffffa50);
      PLYWriter::addProperty
                (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
                 (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
      std::__cxx11::string::~string(local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    }
  }
  if (((local_11 & 1) != 0) && (bVar2 = PointCloud::hasScanPos((PointCloud *)in_RDI), bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,"sx",&local_3d1);
    PLYWriter::addProperty
              (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
               (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"sy",&local_3f9);
    PLYWriter::addProperty
              (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
               (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"sz",&local_421);
    PLYWriter::addProperty
              (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
               (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
  }
  if ((local_11 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"nx",&local_449);
    PLYWriter::addProperty
              (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
               (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_470,"ny",&local_471);
    PLYWriter::addProperty
              (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
               (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
    std::__cxx11::string::~string(local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_498,"nz",&local_499);
    PLYWriter::addProperty
              (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
               (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20));
    std::__cxx11::string::~string(local_498);
    std::allocator<char>::~allocator((allocator<char> *)&local_499);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"face",&local_4c1);
  Mesh::getTriangleCount(&in_RDI->super_Mesh);
  PLYWriter::addElement
            ((PLYWriter *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
             (string *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"vertex_indices",&local_4e9);
  PLYWriter::addProperty
            (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
             (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (ply_type)in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"texcoord",&local_511);
  PLYWriter::addProperty
            (in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
             (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (ply_type)in_stack_fffffffffffffa50);
  pVar8 = (ply_type)((ulong)in_stack_fffffffffffffa50 >> 0x20);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"texnumber",&local_539);
  psVar7 = local_538;
  PLYWriter::addProperty(in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,pVar8);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  local_540 = 0;
  while( true ) {
    uVar3 = PointCloud::getVertexCount((PointCloud *)in_RDI);
    sVar5 = (size_t)uVar3;
    if ((int)uVar3 <= (int)local_540) break;
    uVar3 = local_540;
    PointCloud::getVertexComp((PointCloud *)in_RDI,local_540,0);
    PLYWriter::write(&local_260,uVar3,__buf,sVar5);
    uVar3 = local_540;
    PointCloud::getVertexComp((PointCloud *)in_RDI,local_540,1);
    PLYWriter::write(&local_260,uVar3,__buf_00,sVar5);
    psVar7 = (string *)(ulong)local_540;
    PointCloud::getVertexComp((PointCloud *)in_RDI,local_540,2);
    PLYWriter::write(&local_260,(int)psVar7,__buf_01,sVar5);
    bVar2 = PointCloud::hasScanProp((PointCloud *)in_RDI);
    if (bVar2) {
      psVar7 = (string *)(ulong)local_540;
      PointCloud::getScanSize((PointCloud *)in_RDI,local_540);
      PLYWriter::write(&local_260,(int)psVar7,__buf_02,sVar5);
      if ((local_11 & 1) != 0) {
        uVar3 = local_540;
        PointCloud::getScanError((PointCloud *)in_RDI,local_540);
        PLYWriter::write(&local_260,uVar3,__buf_03,sVar5);
        psVar7 = (string *)(ulong)local_540;
        PointCloud::getScanConf((PointCloud *)in_RDI,local_540);
        PLYWriter::write(&local_260,(int)psVar7,__buf_04,sVar5);
      }
    }
    if (((local_11 & 1) != 0) && (bVar2 = PointCloud::hasScanPos((PointCloud *)in_RDI), bVar2)) {
      uVar3 = local_540;
      PointCloud::getScanPosComp((PointCloud *)in_RDI,local_540,0);
      PLYWriter::write(&local_260,uVar3,__buf_05,sVar5);
      uVar3 = local_540;
      PointCloud::getScanPosComp((PointCloud *)in_RDI,local_540,1);
      PLYWriter::write(&local_260,uVar3,__buf_06,sVar5);
      psVar7 = (string *)(ulong)local_540;
      PointCloud::getScanPosComp((PointCloud *)in_RDI,local_540,2);
      PLYWriter::write(&local_260,(int)psVar7,__buf_07,sVar5);
    }
    if ((local_11 & 1) != 0) {
      uVar3 = local_540;
      Mesh::getNormalComp(&in_RDI->super_Mesh,local_540,0);
      PLYWriter::write(&local_260,uVar3,__buf_08,sVar5);
      uVar3 = local_540;
      Mesh::getNormalComp(&in_RDI->super_Mesh,local_540,1);
      PLYWriter::write(&local_260,uVar3,__buf_09,sVar5);
      psVar7 = (string *)(ulong)local_540;
      Mesh::getNormalComp(&in_RDI->super_Mesh,local_540,2);
      PLYWriter::write(&local_260,(int)psVar7,__buf_10,sVar5);
    }
    local_540 = local_540 + 1;
  }
  local_544 = 0;
  while( true ) {
    iVar6 = (int)psVar7;
    uVar3 = Mesh::getTriangleCount(&in_RDI->super_Mesh);
    sVar5 = (size_t)uVar3;
    if ((int)uVar3 <= local_544) break;
    PLYWriter::writeListSize
              ((PLYWriter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
               (int)in_stack_fffffffffffff98c);
    uVar3 = Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_544,0);
    PLYWriter::write(&local_260,uVar3,__buf_11,sVar5);
    uVar3 = Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_544,1);
    PLYWriter::write(&local_260,uVar3,__buf_12,sVar5);
    uVar3 = Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_544,2);
    PLYWriter::write(&local_260,uVar3,__buf_13,sVar5);
    PLYWriter::writeListSize
              ((PLYWriter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
               (int)in_stack_fffffffffffff98c);
    sVar5 = 0;
    iVar6 = local_544;
    getTextureCoordComp(in_RDI,local_544,0,0);
    PLYWriter::write(&local_260,iVar6,__buf_14,sVar5);
    sVar5 = 1;
    iVar6 = local_544;
    in_stack_fffffffffffff994 = getTextureCoordComp(in_RDI,local_544,0,1);
    PLYWriter::write(&local_260,iVar6,__buf_15,sVar5);
    sVar5 = 0;
    iVar6 = local_544;
    in_stack_fffffffffffff990 = getTextureCoordComp(in_RDI,local_544,1,0);
    PLYWriter::write(&local_260,iVar6,__buf_16,sVar5);
    sVar5 = 1;
    iVar6 = local_544;
    in_stack_fffffffffffff98c = getTextureCoordComp(in_RDI,local_544,1,1);
    PLYWriter::write(&local_260,iVar6,__buf_17,sVar5);
    sVar5 = 0;
    iVar6 = local_544;
    getTextureCoordComp(in_RDI,local_544,2,0);
    PLYWriter::write(&local_260,iVar6,__buf_18,sVar5);
    sVar5 = 1;
    iVar6 = local_544;
    getTextureCoordComp(in_RDI,local_544,2,1);
    PLYWriter::write(&local_260,iVar6,__buf_19,sVar5);
    uVar3 = getTextureIndex(in_RDI,local_544);
    psVar7 = (string *)(ulong)uVar3;
    PLYWriter::write(&local_260,uVar3,__buf_20,sVar5);
    local_544 = local_544 + 1;
  }
  PLYWriter::close(&local_260,iVar6);
  PLYWriter::~PLYWriter((PLYWriter *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
  return;
}

Assistant:

void MultiTexturedMesh::savePLY(const char *plyname, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(plyname, enc);

  // define header

  setOriginToPLY(ply);

  for (size_t i=0; i<name.size(); i++)
  {
    ply.addComment("TextureFile "+getTextureName(static_cast<int>(i)));
  }

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);
  ply.addProperty("texcoord", ply_uint8, ply_float32);
  ply.addProperty("texnumber", ply_int32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));

    ply.writeListSize(6);
    ply.write(getTextureCoordComp(i, 0, 0));
    ply.write(getTextureCoordComp(i, 0, 1));
    ply.write(getTextureCoordComp(i, 1, 0));
    ply.write(getTextureCoordComp(i, 1, 1));
    ply.write(getTextureCoordComp(i, 2, 0));
    ply.write(getTextureCoordComp(i, 2, 1));

    ply.write(getTextureIndex(i));
  }

  ply.close();
}